

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

void save_dungeon(memfile *mf)

{
  uint uVar1;
  d_flags dVar2;
  branch **ppbVar3;
  int value;
  long lVar4;
  dungeon *buf;
  branch *pbVar5;
  
  mtag(mf,0,MTAG_DUNGEON);
  mfmagic_set(mf,0x4e4744);
  mwrite32(mf,n_dgns);
  if (0 < n_dgns) {
    buf = dungeons;
    lVar4 = 0;
    do {
      mtag(mf,(long)buf->ledger_start,MTAG_DUNGEONSTRUCT);
      mwrite(mf,buf,0x18);
      mwrite(mf,buf->proto,0xf);
      mwrite8(mf,buf->boneid);
      dVar2 = buf->flags;
      uVar1 = (int)dVar2 * 0x40000000 + ((uint)dVar2 & 0xc) * 0x4000000;
      mwrite32(mf,((uint)dVar2 & 0x70) << 0x15 |
                  (uVar1 >> 1 & 0x50000000) + (uVar1 & 0x50000000) * 2);
      mwrite8(mf,buf->entry_lev);
      mwrite8(mf,buf->num_dunlevs);
      mwrite8(mf,buf->dunlev_ureached);
      mwrite32(mf,buf->ledger_start);
      mwrite32(mf,buf->depth_start);
      lVar4 = lVar4 + 1;
      buf = buf + 1;
    } while (lVar4 < n_dgns);
  }
  mwrite(mf,&dungeon_topology,0x3e);
  mwrite(mf,tune,6);
  ppbVar3 = &branches;
  value = -1;
  do {
    ppbVar3 = &((branch *)ppbVar3)->next->next;
    value = value + 1;
  } while ((branch *)ppbVar3 != (branch *)0x0);
  mwrite32(mf,value);
  for (pbVar5 = branches; pbVar5 != (branch *)0x0; pbVar5 = pbVar5->next) {
    mtag(mf,(long)pbVar5->id,MTAG_BRANCH);
    mwrite32(mf,pbVar5->id);
    mwrite32(mf,pbVar5->type);
    mwrite(mf,&pbVar5->end1,2);
    mwrite(mf,&pbVar5->end2,2);
    mwrite8(mf,pbVar5->end1_up);
  }
  mwrite(mf,&inv_pos,2);
  return;
}

Assistant:

void save_dungeon(struct memfile *mf)
{
    branch *curr;
    int    count, i;

    mtag(mf, 0, MTAG_DUNGEON);
    mfmagic_set(mf, DGN_MAGIC);

    mwrite32(mf, n_dgns);
    for (i = 0; i < n_dgns; i++)
	save_dungeon_struct(mf, &dungeons[i]);

    /* writing dungeon_topology directly should be ok, it's just a
	* fancy collection of single byte values */
    mwrite(mf, &dungeon_topology, sizeof dungeon_topology);
    mwrite(mf, tune, sizeof tune);

    for (count = 0, curr = branches; curr; curr = curr->next)
	count++;
    mwrite32(mf, count);

    for (curr = branches; curr; curr = curr->next)
	save_branch(mf, curr);

    mwrite(mf, &inv_pos, sizeof(coord));
}